

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::JavascriptSharedArrayBuffer::Finalize(JavascriptSharedArrayBuffer *this,bool isShutdown)

{
  long lVar1;
  Type *this_00;
  JavascriptLibrary *this_01;
  Recycler *this_02;
  Recycler *recycler;
  uint ref;
  bool isShutdown_local;
  JavascriptSharedArrayBuffer *this_local;
  
  if ((this->super_SharedArrayBuffer).sharedContents != (Type)0x0) {
    lVar1 = SharedContents::Release((this->super_SharedArrayBuffer).sharedContents);
    if ((int)lVar1 == 0) {
      (*(this->super_SharedArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x75])
                (this,((this->super_SharedArrayBuffer).sharedContents)->buffer,
                 (ulong)((this->super_SharedArrayBuffer).sharedContents)->bufferLength,
                 (ulong)((this->super_SharedArrayBuffer).sharedContents)->maxBufferLength);
      this_00 = RecyclableObject::GetType((RecyclableObject *)this);
      this_01 = Js::Type::GetLibrary(this_00);
      this_02 = JavascriptLibrary::GetRecycler(this_01);
      Memory::Recycler::ReportExternalMemoryFree
                (this_02,(ulong)((this->super_SharedArrayBuffer).sharedContents)->bufferLength);
      SharedContents::Cleanup((this->super_SharedArrayBuffer).sharedContents);
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SharedContents>
                (&Memory::HeapAllocator::Instance,(this->super_SharedArrayBuffer).sharedContents);
    }
    (this->super_SharedArrayBuffer).sharedContents = (Type)0x0;
  }
  return;
}

Assistant:

void JavascriptSharedArrayBuffer::Finalize(bool isShutdown)
    {
        if (sharedContents == nullptr)
        {
            return;
        }

        uint ref = sharedContents->Release();
        if (ref == 0)
        {
            this->FreeBuffer(sharedContents->buffer, sharedContents->bufferLength, sharedContents->maxBufferLength);

            Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
            recycler->ReportExternalMemoryFree(sharedContents->bufferLength);

            sharedContents->Cleanup();
            HeapDelete(sharedContents);
        }

        sharedContents = nullptr;
    }